

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmAddRgEa<(moira::Instr)4,(moira::Mode)2,(moira::Size)1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  ushort in_CX;
  u32 *in_RDX;
  StrWriter *in_RSI;
  Moira *in_RDI;
  Ea<(moira::Mode)2,_(moira::Size)1> dst;
  Dn src;
  Ea<(moira::Mode)2,_(moira::Size)1> *in_stack_ffffffffffffffc8;
  StrWriter *in_stack_ffffffffffffffd0;
  Dn local_20;
  ushort local_1a;
  u32 *local_18;
  StrWriter *local_10;
  
  local_1a = in_CX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  Dn::Dn(&local_20,(int)(uint)in_CX >> 9 & 7);
  Op<(moira::Mode)2,(moira::Size)1>
            ((Ea<(moira::Mode)2,_(moira::Size)1> *)&stack0xffffffffffffffcc,in_RDI,local_1a & 7,
             local_18);
  pSVar1 = StrWriter::operator<<(local_10);
  pSVar1 = StrWriter::operator<<(pSVar1);
  pSVar1 = StrWriter::operator<<(pSVar1,(Align)(in_RDI->tab).raw);
  pSVar1 = StrWriter::operator<<(pSVar1,local_20);
  StrWriter::operator<<(pSVar1,", ");
  StrWriter::operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void
Moira::dasmAddRgEa(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Dn       ( ____xxx_________(op)       );
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}